

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Barcode.cpp
# Opt level: O0

void __thiscall
ZXing::Result::Result
          (Result *this,DecoderResult *decodeResult,DetectorResult *detectorResult,
          BarcodeFormat format)

{
  PointT<int> PVar1;
  PointT<int> PVar2;
  PointT<int> PVar3;
  QuadrilateralI *pQVar4;
  int *piVar5;
  bool *pbVar6;
  uint *puVar7;
  char *__s;
  undefined8 uVar8;
  undefined4 in_ECX;
  DetectorResult *in_RDX;
  DecoderResult *in_RSI;
  long in_RDI;
  Content *in_stack_ffffffffffffff18;
  Content *in_stack_ffffffffffffff20;
  undefined1 *local_88;
  undefined1 *local_78;
  
  DecoderResult::content(in_RSI);
  Content::Content(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  DecoderResult::error(in_RSI);
  Error::Error((Error *)in_stack_ffffffffffffff20,(Error *)in_stack_ffffffffffffff18);
  pQVar4 = DetectorResult::position(in_RDX);
  PVar1 = (pQVar4->super_array<ZXing::PointT<int>,_4UL>)._M_elems[0];
  PVar2 = (pQVar4->super_array<ZXing::PointT<int>,_4UL>)._M_elems[1];
  PVar3 = (pQVar4->super_array<ZXing::PointT<int>,_4UL>)._M_elems[3];
  *(PointT<int> *)(in_RDI + 0x78) = (pQVar4->super_array<ZXing::PointT<int>,_4UL>)._M_elems[2];
  *(PointT<int> *)(in_RDI + 0x80) = PVar3;
  *(PointT<int> *)(in_RDI + 0x68) = PVar1;
  *(PointT<int> *)(in_RDI + 0x70) = PVar2;
  ReaderOptions::ReaderOptions((ReaderOptions *)0x20ef18);
  DecoderResult::structuredAppend(in_RSI);
  StructuredAppendInfo::StructuredAppendInfo
            ((StructuredAppendInfo *)in_stack_ffffffffffffff20,
             (StructuredAppendInfo *)in_stack_ffffffffffffff18);
  *(undefined4 *)(in_RDI + 0xc0) = in_ECX;
  local_78 = (undefined1 *)(in_RDI + 0xc4);
  do {
    *local_78 = 0;
    local_78 = local_78 + 1;
  } while (local_78 != (undefined1 *)(in_RDI + 200));
  local_88 = (undefined1 *)(in_RDI + 200);
  do {
    *local_88 = 0;
    local_88 = local_88 + 1;
  } while (local_88 != (undefined1 *)(in_RDI + 0xcc));
  piVar5 = DecoderResult::lineCount(in_RSI);
  *(int *)(in_RDI + 0xcc) = *piVar5;
  pbVar6 = DecoderResult::isMirrored(in_RSI);
  *(byte *)(in_RDI + 0xd0) = *pbVar6 & 1;
  *(undefined1 *)(in_RDI + 0xd1) = 0;
  pbVar6 = DecoderResult::readerInit(in_RSI);
  *(byte *)(in_RDI + 0xd2) = *pbVar6 & 1;
  piVar5 = DecoderResult::versionNumber(in_RSI);
  if (*piVar5 != 0) {
    puVar7 = (uint *)DecoderResult::versionNumber(in_RSI);
    snprintf((char *)(in_RDI + 200),4,"%d",(ulong)*puVar7);
  }
  __s = (char *)(in_RDI + 0xc4);
  DecoderResult::ecLevel_abi_cxx11_(in_RSI);
  uVar8 = std::__cxx11::string::data();
  snprintf(__s,4,"%s",uVar8);
  return;
}

Assistant:

Result::Result(DecoderResult&& decodeResult, DetectorResult&& detectorResult, BarcodeFormat format)
	: _content(std::move(decodeResult).content()),
	  _error(std::move(decodeResult).error()),
	  _position(std::move(detectorResult).position()),
	  _sai(decodeResult.structuredAppend()),
	  _format(format),
	  _lineCount(decodeResult.lineCount()),
	  _isMirrored(decodeResult.isMirrored()),
	  _readerInit(decodeResult.readerInit())
#ifdef ZXING_EXPERIMENTAL_API
	  , _symbol(std::make_shared<BitMatrix>(std::move(detectorResult).bits()))
#endif
{
	if (decodeResult.versionNumber())
		snprintf(_version, 4, "%d", decodeResult.versionNumber());
	snprintf(_ecLevel, 4, "%s", decodeResult.ecLevel().data());

	// TODO: add type opaque and code specific 'extra data'? (see DecoderResult::extra())
}